

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O0

void __thiscall
OpenMD::NameFinder::matchBond(NameFinder *this,string *molName,string *bondName,SelectionSet *bs)

{
  bool bVar1;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  *in_RDI;
  iterator k;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  bondAtomNodes;
  iterator j;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  bondNodes;
  iterator i;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  molNodes;
  SelectionSet *in_stack_fffffffffffffee8;
  SelectionSet *in_stack_fffffffffffffef0;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_e0 [2];
  TreeNodePtr *in_stack_ffffffffffffff30;
  NameFinder *in_stack_ffffffffffffff38;
  TreeNodePtr *in_stack_ffffffffffffff40;
  NameFinder *in_stack_ffffffffffffff48;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_a0 [6];
  shared_ptr<OpenMD::TreeNode> *local_70;
  shared_ptr<OpenMD::TreeNode> *local_68;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_60 [12];
  
  std::shared_ptr<OpenMD::TreeNode>::shared_ptr
            ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffef0,
             (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
  getMatchedChildren(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                     (string *)in_stack_ffffffffffffff38);
  std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x3f6548);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  ::__normal_iterator(local_60);
  local_68 = (shared_ptr<OpenMD::TreeNode> *)
             std::
             vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
             ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                      *)in_stack_fffffffffffffee8);
  local_60[0]._M_current = local_68;
  while( true ) {
    local_70 = (shared_ptr<OpenMD::TreeNode> *)
               std::
               vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
               ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                      *)in_stack_fffffffffffffee8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::operator*(local_60);
    std::shared_ptr<OpenMD::TreeNode>::shared_ptr
              ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffef0,
               (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
    getMatchedChildren(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                       (string *)in_stack_ffffffffffffff38);
    std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x3f65fd);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::__normal_iterator(local_a0);
    local_a0[0]._M_current =
         (shared_ptr<OpenMD::TreeNode> *)
         std::
         vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
         ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  *)in_stack_fffffffffffffee8);
    while( true ) {
      std::
      vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
             *)in_stack_fffffffffffffee8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::operator*(local_a0);
      std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3f665f);
      SelectionSet::operator|=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::operator*(local_a0);
      in_stack_fffffffffffffef0 = (SelectionSet *)(local_e0 + 1);
      std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffef0,
                 (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
      getAllChildren(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x3f66b1);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::__normal_iterator(local_e0);
      local_e0[0]._M_current =
           (shared_ptr<OpenMD::TreeNode> *)
           std::
           vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                    *)in_stack_fffffffffffffee8);
      while( true ) {
        std::
        vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
        ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
               *)in_stack_fffffffffffffee8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                            *)in_stack_fffffffffffffef0,
                           (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                            *)in_stack_fffffffffffffee8);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
        ::operator*(local_e0);
        std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3f670d);
        SelectionSet::operator|=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
        ::operator++(local_e0);
      }
      std::
      vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ::~vector(in_RDI);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::operator++(local_a0);
    }
    std::
    vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
    ~vector(in_RDI);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::operator++(local_60);
  }
  std::
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
  ~vector(in_RDI);
  return;
}

Assistant:

void NameFinder::matchBond(const std::string& molName,
                             const std::string& bondName, SelectionSet& bs) {
    std::vector<TreeNodePtr> molNodes = getMatchedChildren(root_, molName);
    std::vector<TreeNodePtr>::iterator i;
    for (i = molNodes.begin(); i != molNodes.end(); ++i) {
      std::vector<TreeNodePtr> bondNodes = getMatchedChildren(*i, bondName);
      std::vector<TreeNodePtr>::iterator j;
      for (j = bondNodes.begin(); j != bondNodes.end(); ++j) {
        bs |= (*j)->bs;
        std::vector<TreeNodePtr> bondAtomNodes = getAllChildren(*j);
        std::vector<TreeNodePtr>::iterator k;
        for (k = bondAtomNodes.begin(); k != bondAtomNodes.end(); ++k) {
          bs |= (*k)->bs;
        }
      }
    }
  }